

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O1

void knote_release(knote *kn)

{
  atomic_uint *paVar1;
  
  LOCK();
  paVar1 = &kn->kn_ref;
  *paVar1 = *paVar1 - 1;
  UNLOCK();
  if ((*paVar1 == 0) && ((int)kn->kn_flags < 0)) {
    free(kn);
    return;
  }
  return;
}

Assistant:

void
knote_release(struct knote *kn)
{
    assert (kn->kn_ref > 0);

    if (atomic_dec(&kn->kn_ref) == 0) {
        if (kn->kn_flags & KNFL_KNOTE_DELETED) {
            dbg_printf("kn=%p - freeing", kn);
#ifndef NDEBUG
            memset(kn, 0x42, sizeof(*kn));
#endif
            free(kn);
        } else {
            dbg_puts("kn=%p - attempted to free knote without marking it as deleted");
        }
    } else {
        dbg_printf("kn=%p rc=%d - decrementing refcount", kn, kn->kn_ref);
    }
}